

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O1

string * __thiscall
flatbuffers::FloatConstantGenerator::GenFloatConstantImpl<float>
          (string *__return_storage_ptr__,FloatConstantGenerator *this,FieldDef *field)

{
  char *__nptr;
  bool bVar1;
  float fVar2;
  float fVar3;
  char *local_30;
  
  __nptr = (field->value).constant._M_dataplus._M_p;
  if (__nptr == (char *)0x0) {
    __assert_fail("str && val",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                  ,0x138,"bool flatbuffers::StringToFloatImpl(T *, const char *const) [T = float]");
  }
  local_30 = __nptr;
  fVar2 = strtof_l(__nptr,&local_30,ClassicLocale::instance_);
  if (local_30 == __nptr) {
    bVar1 = false;
  }
  else {
    bVar1 = *local_30 == '\0';
  }
  fVar3 = 0.0;
  if ((bVar1) && (fVar3 = fVar2, NAN(fVar2))) {
    fVar3 = NAN;
  }
  if (bVar1) {
    if (NAN(fVar3)) {
      (*this->_vptr_FloatConstantGenerator[7])(__return_storage_ptr__,this);
    }
    else if (ABS(fVar3) == INFINITY) {
      (*this->_vptr_FloatConstantGenerator[6])(__return_storage_ptr__,this);
    }
    else {
      (*this->_vptr_FloatConstantGenerator[5])(__return_storage_ptr__,this,&(field->value).constant)
      ;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("done",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/code_generators.cpp"
                ,0xe0,
                "std::string flatbuffers::FloatConstantGenerator::GenFloatConstantImpl(const FieldDef &) const [T = float]"
               );
}

Assistant:

void GenComment(const std::vector<std::string> &dc, std::string *code_ptr,
                const CommentConfig *config, const char *prefix) {
  if (dc.begin() == dc.end()) {
    // Don't output empty comment blocks with 0 lines of comment content.
    return;
  }

  std::string &code = *code_ptr;
  if (config != nullptr && config->first_line != nullptr) {
    code += std::string(prefix) + std::string(config->first_line) + "\n";
  }
  std::string line_prefix =
      std::string(prefix) +
      ((config != nullptr && config->content_line_prefix != nullptr)
           ? config->content_line_prefix
           : "///");
  for (auto it = dc.begin(); it != dc.end(); ++it) {
    code += line_prefix + *it + "\n";
  }
  if (config != nullptr && config->last_line != nullptr) {
    code += std::string(prefix) + std::string(config->last_line) + "\n";
  }
}